

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

void __thiscall
Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
Bitfield_encoding(Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *this,
                 vertex_t n,dimension_t k)

{
  int iVar1;
  overflow_error *this_00;
  undefined7 in_register_00000011;
  int iVar2;
  string sStack_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = log2up<int>(n);
  this->bits_per_vertex = iVar1;
  iVar2 = (int)CONCAT71(in_register_00000011,k);
  iVar1 = iVar1 * iVar2;
  this->extra_bits = 0x80 - iVar1;
  if (iVar1 < 0x81) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_f8,iVar2 + -1);
  std::operator+(&local_d8,"cannot encode all simplices of dimension ",&local_f8);
  std::operator+(&local_b8,&local_d8," with ");
  std::__cxx11::to_string(&local_118,n);
  std::operator+(&local_98,&local_b8,&local_118);
  std::operator+(&local_78,&local_98," vertices using only ");
  std::__cxx11::to_string(&sStack_138,0x80);
  std::operator+(&local_58,&local_78,&sStack_138);
  std::operator+(&local_38,&local_58," bits");
  std::overflow_error::overflow_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

Bitfield_encoding(vertex_t n, dimension_t k) : bits_per_vertex(log2up(n)) {
      static_assert(std::numeric_limits<simplex_t>::radix == 2);
      const int available_bits = std::numeric_limits<simplex_t>::digits;
      extra_bits = available_bits - bits_per_vertex * k;
      if (extra_bits < 0)
        throw std::overflow_error("cannot encode all simplices of dimension " + std::to_string(k - 1) + " with " + std::to_string(n) + " vertices using only " + std::to_string(available_bits) + " bits");
      // The message is a bit misleading, it is tuples that we cannot encode, and just with this representation.
    }